

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  int iVar1;
  SQInteger SVar2;
  byte bVar3;
  long lVar4;
  
  SVar2 = (*this->_readf)(this->_up);
  if (0xff < SVar2) {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  if (SVar2 == 0) {
    this->_currdata = '\0';
    this->_reached_eof = 1;
  }
  else {
    this->_currdata = (LexChar)SVar2;
  }
  this->_currentcolumn = this->_currentcolumn + 1;
  iVar1 = isxdigit((uint)this->_currdata);
  if (iVar1 == 0) {
    (*this->_errfunc)(this->_errtarget,"hexadecimal number expected");
  }
  bVar3 = this->_currdata;
  iVar1 = isxdigit((uint)bVar3);
  lVar4 = 0;
  if (0 < maxdigits && iVar1 != 0) {
    do {
      dest[lVar4] = bVar3;
      SVar2 = (*this->_readf)(this->_up);
      if (0xff < SVar2) {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      if (SVar2 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        this->_currdata = (LexChar)SVar2;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      lVar4 = lVar4 + 1;
      bVar3 = this->_currdata;
      iVar1 = isxdigit((uint)bVar3);
    } while ((iVar1 != 0) && (lVar4 < maxdigits));
  }
  dest[lVar4] = '\0';
  return lVar4;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR)) Error(_SC("hexadecimal number expected"));
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}